

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

int fast_detect_non_zero_motion
              (AV1_COMP *cpi,uint8_t *src_y,int src_ystride,uint8_t *last_src_y,int last_src_ystride
              ,int mi_row,int mi_col)

{
  BLOCK_SIZE BVar1;
  SequenceHeader *pSVar2;
  uint uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  uint8_t *search_pos [4];
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  
  pSVar2 = (cpi->common).seq_params;
  BVar1 = pSVar2->sb_size;
  if (cpi->src_sad_blk_64x64 == (uint64_t *)0x0) {
    uVar3 = (*cpi->ppi->fn_ptr[BVar1].sdf)(src_y,src_ystride,last_src_y,last_src_ystride);
  }
  else {
    iVar4 = pSVar2->mib_size >> (BVar1 == BLOCK_128X128);
    uVar3 = (uint)cpi->src_sad_blk_64x64
                  [(mi_row / iVar4) * (((cpi->common).mi_params.mi_cols + iVar4 + -1) / iVar4) +
                   mi_col / iVar4];
  }
  local_58 = last_src_y + -(long)last_src_ystride;
  local_50 = last_src_y + -1;
  local_48 = last_src_y + 1;
  local_40 = last_src_y + last_src_ystride;
  (*cpi->ppi->fn_ptr[BVar1].sdx4df)(src_y,src_ystride,&local_58,last_src_ystride,&local_68);
  uVar3 = uVar3 * 5;
  auVar5._0_4_ = -(uint)((int)(uVar3 >> 3 | 0x80000000) < (int)(local_68 ^ 0x80000000));
  auVar5._4_4_ = -(uint)((int)(uVar3 >> 3 | 0x80000000) < (int)(uStack_64 ^ 0x80000000));
  auVar5._8_4_ = -(uint)((int)(uVar3 >> 3 | 0x80000000) < (int)(uStack_60 ^ 0x80000000));
  auVar5._12_4_ = -(uint)((int)(uVar3 >> 3 | 0x80000000) < (int)(uStack_5c ^ 0x80000000));
  iVar4 = movmskps(last_src_ystride,auVar5);
  return (uint)(iVar4 == 0xf);
}

Assistant:

static int fast_detect_non_zero_motion(AV1_COMP *cpi, const uint8_t *src_y,
                                       int src_ystride,
                                       const uint8_t *last_src_y,
                                       int last_src_ystride, int mi_row,
                                       int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const BLOCK_SIZE bsize = cm->seq_params->sb_size;
  unsigned int blk_sad = INT_MAX;
  if (cpi->src_sad_blk_64x64 != NULL) {
    const int sb_size_by_mb = (bsize == BLOCK_128X128)
                                  ? (cm->seq_params->mib_size >> 1)
                                  : cm->seq_params->mib_size;
    const int sb_cols =
        (cm->mi_params.mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
    const int sbi_col = mi_col / sb_size_by_mb;
    const int sbi_row = mi_row / sb_size_by_mb;
    blk_sad = (unsigned int)cpi->src_sad_blk_64x64[sbi_col + sbi_row * sb_cols];
  } else {
    blk_sad = cpi->ppi->fn_ptr[bsize].sdf(src_y, src_ystride, last_src_y,
                                          last_src_ystride);
  }

  // Search 4 1-away points.
  const uint8_t *const search_pos[4] = {
    last_src_y - last_src_ystride,
    last_src_y - 1,
    last_src_y + 1,
    last_src_y + last_src_ystride,
  };
  unsigned int sad_arr[4];
  cpi->ppi->fn_ptr[bsize].sdx4df(src_y, src_ystride, search_pos,
                                 last_src_ystride, sad_arr);

  blk_sad = (blk_sad * 5) >> 3;
  return (blk_sad < sad_arr[0] && blk_sad < sad_arr[1] &&
          blk_sad < sad_arr[2] && blk_sad < sad_arr[3]);
}